

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

PrimitiveSymbol * slang::ast::PrimitiveSymbol::fromSyntax(Scope *scope,UdpDeclarationSyntax *syntax)

{
  Token *pTVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  LookupLocation lookupLocation;
  basic_string_view<char,_std::char_traits<char>_> __x;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_04;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  Token nameToken;
  Token nameToken_00;
  Token nameToken_01;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  SourceRange sourceRange_07;
  Token TVar2;
  Token TVar3;
  ulong uVar4;
  Scope *pSVar5;
  string_view *psVar6;
  bool bVar7;
  logic_t lVar8;
  byte bVar9;
  int iVar10;
  bitwidth_t bVar11;
  AnsiUdpPortListSyntax *pAVar12;
  NonAnsiUdpPortListSyntax *pNVar13;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>
  *pSVar14;
  pointer ppVar15;
  SyntaxNode *pSVar16;
  undefined4 extraout_var;
  size_type sVar17;
  reference ppPVar18;
  SourceLocation SVar19;
  undefined4 extraout_var_00;
  UdpBodySyntax *pUVar20;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  BumpAllocator *extraout_RDX_02;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  string_view sVar21;
  iterator iVar22;
  SourceRange SVar23;
  SourceRange SVar24;
  UdpEntrySyntax *entry;
  iterator __end4_3;
  iterator __begin4_3;
  SyntaxList<slang::syntax::UdpEntrySyntax> *__range4_3;
  SmallVector<slang::ast::PrimitiveSymbol::TableEntry,_2UL> table;
  PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> trieAlloc;
  BumpAllocator alloc;
  BitTrie trie;
  SVInt *val;
  Expression *expr;
  ASTContext context;
  Diagnostic *diag_6;
  string_view initialName;
  Diagnostic *diag_5;
  UdpInitialStmtSyntax *initial;
  size_t i;
  UdpOutputPortDeclSyntax *outSyntax;
  SyntaxNode *portSyntax;
  ExpressionSyntax *initExpr;
  Diagnostic *diag_4;
  PrimitivePortSymbol *port_6;
  iterator __end4_2;
  iterator __begin4_2;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *__range4_2;
  Diagnostic *diag_3;
  PrimitivePortSymbol *port_5;
  iterator it_2;
  Token name_4;
  Diagnostic *diag_2;
  PrimitivePortSymbol *port_4;
  iterator it_1;
  Token name_3;
  IdentifierNameSyntax *nameSyntax_2;
  iterator __end6;
  iterator __begin6;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range6;
  UdpInputPortDeclSyntax *inputDecl_1;
  Diagnostic *diag_1;
  PrimitivePortSymbol *port_3;
  Diagnostic *diag;
  iterator it;
  Token name_2;
  UdpOutputPortDeclSyntax *outputDecl_1;
  UdpPortDeclSyntax *decl_1;
  iterator __end4_1;
  iterator __begin4_1;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *__range4_1;
  UdpOutputPortDeclSyntax *regSpecifier;
  anon_class_8_1_a89d2d74 checkDup;
  PrimitivePortSymbol *port_2;
  Token name_1;
  IdentifierNameSyntax *nameSyntax_1;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range4;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
  portMap;
  PrimitivePortSymbol *port_1;
  Token name;
  IdentifierNameSyntax *nameSyntax;
  iterator __end5;
  iterator __begin5;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range5;
  UdpInputPortDeclSyntax *inputDecl;
  PrimitivePortSymbol *port;
  PrimitivePortDirection dir;
  UdpOutputPortDeclSyntax *outputDecl;
  UdpPortDeclSyntax *decl;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *__range3;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  SyntaxNode *externPrim;
  UdpPortListSyntax *portList;
  PrimitiveSymbol *prim;
  string_view primName;
  Compilation *comp;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_3;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  size_t hash_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  Symbol *in_stack_ffffffffffffeb58;
  Diagnostic *in_stack_ffffffffffffeb60;
  BumpAllocator *this;
  SourceLocation in_stack_ffffffffffffeb68;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffeb70;
  Scope *in_stack_ffffffffffffeb78;
  Token *in_stack_ffffffffffffeb80;
  Compilation *in_stack_ffffffffffffeb88;
  undefined4 in_stack_ffffffffffffeb90;
  undefined1 in_stack_ffffffffffffeb94;
  undefined1 in_stack_ffffffffffffeb95;
  undefined1 in_stack_ffffffffffffeb96;
  undefined1 in_stack_ffffffffffffeb97;
  undefined4 in_stack_ffffffffffffeb98;
  undefined2 in_stack_ffffffffffffeb9c;
  undefined1 in_stack_ffffffffffffeb9e;
  undefined1 in_stack_ffffffffffffeb9f;
  undefined4 in_stack_ffffffffffffeba0;
  undefined4 in_stack_ffffffffffffeba4;
  int32_t index;
  undefined7 in_stack_ffffffffffffeba8;
  undefined1 in_stack_ffffffffffffebaf;
  SyntaxNode *in_stack_ffffffffffffebb0;
  PrimitivePortSymbol *in_stack_ffffffffffffebb8;
  anon_class_8_1_a89d2d74 *in_stack_ffffffffffffebc0;
  undefined4 in_stack_ffffffffffffebc8;
  undefined4 in_stack_ffffffffffffebcc;
  Scope *in_stack_ffffffffffffebd0;
  undefined7 in_stack_ffffffffffffebd8;
  undefined1 in_stack_ffffffffffffebdf;
  try_emplace_args_t *in_stack_ffffffffffffebe0;
  ExpressionSyntax *pEVar25;
  char *in_stack_ffffffffffffebe8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
  *in_stack_ffffffffffffebf0;
  Scope *in_stack_ffffffffffffec00;
  SourceLocation in_stack_ffffffffffffec08;
  undefined8 in_stack_ffffffffffffec10;
  DiagCode DVar26;
  DiagCode code;
  SourceLocation in_stack_ffffffffffffec98;
  SourceLocation in_stack_ffffffffffffeca0;
  SourceLocation in_stack_ffffffffffffeca8;
  undefined8 in_stack_ffffffffffffecb0;
  BitTrie *in_stack_ffffffffffffed80;
  Scope *in_stack_ffffffffffffed88;
  PrimitiveSymbol *in_stack_ffffffffffffed90;
  ParentList *in_stack_ffffffffffffeef8;
  UdpInputPortDeclSyntax *in_stack_ffffffffffffef00;
  Diagnostic *in_stack_ffffffffffffef08;
  bitmask<slang::ast::EvalFlags> extraFlags;
  PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> *in_stack_ffffffffffffef48;
  PrimitivePortSymbol *in_stack_ffffffffffffef50;
  Scope *in_stack_ffffffffffffef58;
  SourceLocation in_stack_ffffffffffffef60;
  undefined7 in_stack_ffffffffffffef68;
  undefined1 in_stack_ffffffffffffef6f;
  Diagnostic *in_stack_ffffffffffffef70;
  pointer local_d38;
  size_t sStack_d30;
  __normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
  local_d18;
  SyntaxList<slang::syntax::UdpEntrySyntax> *local_d10;
  SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> local_d08;
  PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> local_cc0;
  BumpAllocator local_cb0;
  BitTrie local_ca0;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined4 local_c40;
  undefined1 local_c3a;
  uint8_t local_c39;
  uint8_t local_c21;
  uint8_t local_c0a;
  uint8_t local_c09;
  SVInt *local_c08;
  bitmask<slang::ast::EvalFlags> local_bf9 [41];
  bitmask<slang::ast::ASTFlags> local_bd0;
  int *local_bc8;
  bitmask<slang::ast::ASTFlags> local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  sockaddr local_ba0 [3];
  SourceLocation local_b68;
  undefined4 local_b5c;
  string_view local_b58;
  SourceRange local_b48;
  undefined4 local_b34;
  Diagnostic *local_b30;
  size_t local_b28;
  char *local_b20;
  string_view local_b18;
  string_view local_b00;
  Token local_af0;
  SourceLocation local_ae0;
  undefined4 local_ad4;
  SourceRange local_ad0;
  undefined4 local_abc;
  Diagnostic *local_ab8;
  SourceRange local_ab0;
  undefined4 local_a9c;
  long local_a98;
  SourceLocation local_a90;
  undefined4 local_a84;
  ulong local_a80;
  UdpOutputPortDeclSyntax *local_a78;
  SyntaxNode *local_a70;
  ExpressionSyntax *local_a68;
  SourceLocation local_a60;
  undefined4 local_a54;
  SourceLocation local_a50;
  undefined4 local_a44;
  undefined8 local_a40;
  pointer local_a30;
  size_t local_a28;
  undefined4 local_a1c;
  size_t local_a18;
  char *pcStack_a10;
  SourceLocation local_a00;
  undefined4 local_9f4;
  Diagnostic *local_9f0;
  PrimitivePortSymbol *local_9e8;
  iterator local_9e0;
  iterator local_9d8;
  SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *local_9d0;
  size_t local_9c8;
  char *pcStack_9c0;
  SourceRange local_9b8;
  undefined4 local_9a4;
  Diagnostic *local_9a0;
  Symbol *local_998;
  Info *pIStack_990;
  PrimitivePortSymbol *local_980;
  string_view local_978;
  SymbolMap *local_968;
  Symbol *local_960;
  Symbol *local_958;
  Info *pIStack_950;
  string_view local_940;
  SourceRange local_930;
  undefined4 local_91c;
  Diagnostic *local_918;
  string_view local_910 [2];
  SourceLocation local_8f0;
  Token local_8e8;
  PrimitivePortSymbol *local_8d0;
  iterator local_8c8;
  string_view local_8b8;
  char_pointer local_8a8;
  table_element_pointer local_8a0;
  Token local_898;
  IdentifierNameSyntax *local_888;
  iterator local_880;
  ParentList *local_870;
  size_t local_868;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *local_860;
  UdpInputPortDeclSyntax *local_858;
  string_view local_850;
  SourceRange local_840;
  undefined4 local_82c;
  Diagnostic *local_828;
  basic_string_view<char,_std::char_traits<char>_> local_820 [2];
  SourceLocation local_800;
  Token local_7f8;
  PrimitivePortSymbol *local_7e0;
  SourceLocation local_7d8;
  undefined4 local_7cc;
  SourceRange local_7c8;
  undefined4 local_7b4;
  Diagnostic *local_7b0;
  iterator local_7a8;
  string_view local_798;
  char_pointer local_788;
  table_element_pointer local_780;
  Token local_778;
  UdpOutputPortDeclSyntax *local_760;
  UdpPortDeclSyntax *local_758;
  iterator local_750;
  iterator local_740;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *local_730;
  UdpOutputPortDeclSyntax *local_728;
  Scope *local_720;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_718;
  string_view local_700;
  string_view local_6f0;
  undefined4 local_6dc;
  SourceLocation local_6d8;
  string_view local_6d0;
  PrimitivePortSymbol *local_6c0;
  Token local_6b8;
  SourceLocation local_6a8;
  iterator local_6a0;
  iterator local_690;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *local_680;
  undefined1 local_610 [16];
  size_t local_600;
  ulong local_5e8;
  ulong local_5e0;
  SourceRange local_5d8;
  undefined4 local_5c4;
  undefined4 local_5ac;
  SourceLocation local_5a8;
  string_view local_5a0;
  PrimitivePortSymbol *local_590;
  Token local_588;
  IdentifierNameSyntax *local_570;
  iterator local_568;
  iterator local_558;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *local_548;
  UdpInputPortDeclSyntax *local_540;
  SourceLocation local_528;
  string_view local_520;
  PrimitivePortSymbol *local_510;
  undefined4 local_504;
  UdpOutputPortDeclSyntax *local_500;
  UdpPortDeclSyntax *local_4f8;
  iterator local_4f0;
  iterator local_4e0;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *local_4c0;
  SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> local_4b8 [2];
  size_t local_478;
  char *local_470;
  SourceRange local_468;
  undefined4 local_454;
  size_t local_450;
  char *local_448;
  SyntaxNode *local_440;
  SyntaxNode *local_438;
  undefined4 local_41c;
  SourceLocation local_418;
  PrimitiveSymbol *local_410;
  string_view local_408;
  Compilation *local_3f8;
  SyntaxNode *local_3f0;
  undefined8 local_3e8;
  PrimitiveSymbol *local_3e0;
  Symbol *local_3d8;
  string_view *local_3d0;
  undefined1 *local_3c8;
  Scope *local_3c0;
  undefined1 *local_3b8;
  SymbolMap *local_3b0;
  Symbol *local_3a8;
  string_view *local_3a0;
  undefined1 *local_398;
  char_pointer local_390;
  table_element_pointer local_388;
  string_view *local_380;
  undefined1 *local_378;
  char_pointer local_370;
  table_element_pointer local_368;
  undefined1 local_359;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_void>
  local_358;
  Symbol *local_350;
  basic_string_view<char,_std::char_traits<char>_> *local_348;
  undefined1 *local_340;
  bool local_331 [25];
  iterator local_318;
  bool local_301 [25];
  iterator local_2e8;
  bool local_2d1;
  iterator local_2d0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
  local_2c0;
  size_t local_2a8;
  size_t local_2a0;
  basic_string_view<char,_std::char_traits<char>_> *local_298;
  Symbol *local_290;
  basic_string_view<char,_std::char_traits<char>_> *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  uint local_26c;
  value_type *local_268;
  value_type *local_260;
  uint local_254;
  group_type *local_250;
  size_t local_248;
  pow2_quadratic_prober local_240;
  size_t local_230;
  size_t local_228;
  basic_string_view<char,_std::char_traits<char>_> *local_220;
  undefined1 *local_218;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
  local_210;
  string_view *local_1f8;
  undefined1 *local_1f0;
  iterator local_1e8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
  local_1d8;
  string_view *local_1c0;
  undefined1 *local_1b8;
  iterator local_1b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
  local_1a0;
  Scope *local_188;
  undefined1 *local_180;
  iterator local_178;
  size_t local_168;
  Scope *local_160;
  undefined1 *local_158;
  uint local_14c;
  value_type *local_148;
  value_type *local_140;
  uint local_134;
  group_type *local_130;
  size_t local_128;
  pow2_quadratic_prober local_120;
  size_t local_110;
  size_t local_108;
  Scope *local_100;
  undefined1 *local_f8;
  size_t local_f0;
  string_view *local_e8;
  undefined1 *local_e0;
  uint local_d4;
  value_type *local_d0;
  value_type *local_c8;
  uint local_bc;
  group_type *local_b8;
  size_t local_b0;
  pow2_quadratic_prober local_a8;
  size_t local_98;
  size_t local_90;
  string_view *local_88;
  undefined1 *local_80;
  size_t local_78;
  string_view *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  string_view *local_10;
  undefined1 *local_8;
  
  local_3f0 = in_RSI;
  local_3e8 = in_RDI;
  local_3f8 = Scope::getCompilation(in_RDI);
  local_408 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
  local_418 = parsing::Token::location((Token *)(local_3f0 + 4));
  local_41c = 0;
  local_410 = BumpAllocator::
              emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::PrimitiveSymbol::PrimitiveKind>
                        ((BumpAllocator *)
                         CONCAT17(in_stack_ffffffffffffeb97,
                                  CONCAT16(in_stack_ffffffffffffeb96,
                                           CONCAT15(in_stack_ffffffffffffeb95,
                                                    CONCAT14(in_stack_ffffffffffffeb94,
                                                             in_stack_ffffffffffffeb90)))),
                         in_stack_ffffffffffffeb88,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffeb80,(SourceLocation *)in_stack_ffffffffffffeb78,
                         (PrimitiveKind *)in_stack_ffffffffffffeb70.m_bits);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffeb70.m_bits,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_ffffffffffffeb68);
  syntax_00._M_ptr._4_2_ = in_stack_ffffffffffffeb9c;
  syntax_00._M_ptr._0_4_ = in_stack_ffffffffffffeb98;
  syntax_00._M_ptr._6_1_ = in_stack_ffffffffffffeb9e;
  syntax_00._M_ptr._7_1_ = in_stack_ffffffffffffeb9f;
  syntax_00._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffeba0;
  syntax_00._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffeba4;
  Symbol::setAttributes
            ((Symbol *)
             CONCAT17(in_stack_ffffffffffffeb97,
                      CONCAT16(in_stack_ffffffffffffeb96,
                               CONCAT15(in_stack_ffffffffffffeb95,
                                        CONCAT14(in_stack_ffffffffffffeb94,in_stack_ffffffffffffeb90
                                                )))),(Scope *)in_stack_ffffffffffffeb88,syntax_00);
  Symbol::setSyntax(&local_410->super_Symbol,local_3f0);
  local_438 = &not_null<slang::syntax::UdpPortListSyntax_*>::get
                         ((not_null<slang::syntax::UdpPortListSyntax_*> *)&local_3f0[4].previewNode)
               ->super_SyntaxNode;
  if (((SyntaxNode *)&local_438->kind)->kind == WildcardUdpPortList) {
    local_450 = local_408._M_len;
    local_448 = local_408._M_str;
    sVar21._M_str = in_stack_ffffffffffffebe8;
    sVar21._M_len = (size_t)in_stack_ffffffffffffebe0;
    local_440 = Compilation::getExternDefinition
                          ((Compilation *)
                           CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),sVar21,
                           in_stack_ffffffffffffebd0);
    if ((local_440 == (SyntaxNode *)0x0) || (local_440->kind != ExternUdpDecl)) {
      local_454 = 0x7d0006;
      local_468 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffebb0);
      SVar23.endLoc = in_stack_ffffffffffffeca8;
      SVar23.startLoc = in_stack_ffffffffffffeca0;
      Scope::addDiag((Scope *)in_stack_ffffffffffffec98,
                     SUB84((ulong)in_stack_ffffffffffffecb0 >> 0x20,0),SVar23);
      local_478 = local_408._M_len;
      local_470 = local_408._M_str;
      arg._M_len._7_1_ = in_stack_ffffffffffffebaf;
      arg._M_len._0_7_ = in_stack_ffffffffffffeba8;
      arg._M_str = (char *)in_stack_ffffffffffffebb0;
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT44(in_stack_ffffffffffffeba4,in_stack_ffffffffffffeba0),arg);
    }
    else {
      slang::syntax::SyntaxNode::as<slang::syntax::ExternUdpDeclSyntax>(local_440);
      local_438 = &not_null::operator_cast_to_UdpPortListSyntax_
                             ((not_null<slang::syntax::UdpPortListSyntax_*> *)0x3e4306)->
                   super_SyntaxNode;
    }
  }
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *)0x3e431d);
  TVar3.info = local_af0.info;
  TVar3.kind = local_af0.kind;
  TVar3._2_1_ = local_af0._2_1_;
  TVar3.numFlags.raw = local_af0.numFlags.raw;
  TVar3.rawLen = local_af0.rawLen;
  if (local_438->kind == AnsiUdpPortList) {
    pAVar12 = slang::syntax::SyntaxNode::as<slang::syntax::AnsiUdpPortListSyntax>(local_438);
    local_4c0 = &pAVar12->ports;
    local_4e0 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::begin
                          ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x3e4366);
    local_4f0 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::end
                          ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)
                           in_stack_ffffffffffffeb60);
    while( true ) {
      bVar7 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>_>
                        ((self_type *)in_stack_ffffffffffffeb60,
                         (iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)
                         in_stack_ffffffffffffeb58);
      if (((bVar7 ^ 0xffU) & 1) == 0) break;
      local_4f8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                               *)0x3e4414);
      if ((local_4f8->super_SyntaxNode).kind == UdpOutputPortDecl) {
        local_500 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                              (&local_4f8->super_SyntaxNode);
        local_504 = 1;
        bVar7 = parsing::Token::operator_cast_to_bool((Token *)0x3e4485);
        if (bVar7) {
          local_504 = 2;
        }
        sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
        local_520 = sVar21;
        local_528 = parsing::Token::location(&local_500->name);
        local_510 = BumpAllocator::
                    emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection&>
                              ((BumpAllocator *)
                               CONCAT17(in_stack_ffffffffffffeb97,
                                        CONCAT16(in_stack_ffffffffffffeb96,
                                                 CONCAT15(in_stack_ffffffffffffeb95,
                                                          CONCAT14(in_stack_ffffffffffffeb94,
                                                                   in_stack_ffffffffffffeb90)))),
                               in_stack_ffffffffffffeb88,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffeb80,(SourceLocation *)in_stack_ffffffffffffeb78
                               ,(PrimitivePortDirection *)in_stack_ffffffffffffeb70.m_bits);
        Symbol::setSyntax((Symbol *)local_510,&local_4f8->super_SyntaxNode);
        std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)in_stack_ffffffffffffeb70.m_bits,
                   (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_ffffffffffffeb68);
        syntax_01._M_ptr._4_2_ = in_stack_ffffffffffffeb9c;
        syntax_01._M_ptr._0_4_ = in_stack_ffffffffffffeb98;
        syntax_01._M_ptr._6_1_ = in_stack_ffffffffffffeb9e;
        syntax_01._M_ptr._7_1_ = in_stack_ffffffffffffeb9f;
        syntax_01._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffeba0;
        syntax_01._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffeba4;
        Symbol::setAttributes
                  ((Symbol *)
                   CONCAT17(in_stack_ffffffffffffeb97,
                            CONCAT16(in_stack_ffffffffffffeb96,
                                     CONCAT15(in_stack_ffffffffffffeb95,
                                              CONCAT14(in_stack_ffffffffffffeb94,
                                                       in_stack_ffffffffffffeb90)))),
                   (Scope *)in_stack_ffffffffffffeb88,syntax_01);
        SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)
                   in_stack_ffffffffffffeb60,(PrimitivePortSymbol **)in_stack_ffffffffffffeb58);
        Scope::addMember((Scope *)in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
      }
      else {
        local_540 = slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                              (&local_4f8->super_SyntaxNode);
        local_548 = &local_540->names;
        iVar22 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                           ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0x3e4684);
        local_558 = iVar22;
        iVar22 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                           ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)
                            in_stack_ffffffffffffeb60);
        local_568 = iVar22;
        while( true ) {
          bVar7 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
                            ((self_type *)in_stack_ffffffffffffeb60,
                             (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)
                             in_stack_ffffffffffffeb58);
          if (((bVar7 ^ 0xffU) & 1) == 0) break;
          local_570 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                      ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                                   *)0x3e4732);
          local_588.kind = (local_570->identifier).kind;
          local_588._2_1_ = (local_570->identifier).field_0x2;
          local_588.numFlags.raw = (local_570->identifier).numFlags.raw;
          local_588.rawLen = (local_570->identifier).rawLen;
          local_588.info = (local_570->identifier).info;
          sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
          local_5a0 = sVar21;
          local_5a8 = parsing::Token::location(&local_588);
          local_5ac = 0;
          local_590 = BumpAllocator::
                      emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                                ((BumpAllocator *)
                                 CONCAT17(in_stack_ffffffffffffeb97,
                                          CONCAT16(in_stack_ffffffffffffeb96,
                                                   CONCAT15(in_stack_ffffffffffffeb95,
                                                            CONCAT14(in_stack_ffffffffffffeb94,
                                                                     in_stack_ffffffffffffeb90)))),
                                 in_stack_ffffffffffffeb88,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffeb80,
                                 (SourceLocation *)in_stack_ffffffffffffeb78,
                                 (PrimitivePortDirection *)in_stack_ffffffffffffeb70.m_bits);
          Symbol::setSyntax((Symbol *)local_590,(SyntaxNode *)local_570);
          std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
          span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                    ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                      *)in_stack_ffffffffffffeb70.m_bits,
                     (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_ffffffffffffeb68
                    );
          syntax_02._M_ptr._4_2_ = in_stack_ffffffffffffeb9c;
          syntax_02._M_ptr._0_4_ = in_stack_ffffffffffffeb98;
          syntax_02._M_ptr._6_1_ = in_stack_ffffffffffffeb9e;
          syntax_02._M_ptr._7_1_ = in_stack_ffffffffffffeb9f;
          syntax_02._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffeba0;
          syntax_02._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffeba4;
          Symbol::setAttributes
                    ((Symbol *)
                     CONCAT17(in_stack_ffffffffffffeb97,
                              CONCAT16(in_stack_ffffffffffffeb96,
                                       CONCAT15(in_stack_ffffffffffffeb95,
                                                CONCAT14(in_stack_ffffffffffffeb94,
                                                         in_stack_ffffffffffffeb90)))),
                     (Scope *)in_stack_ffffffffffffeb88,syntax_02);
          SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::push_back
                    ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)
                     in_stack_ffffffffffffeb60,(PrimitivePortSymbol **)in_stack_ffffffffffffeb58);
          Scope::addMember((Scope *)in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                      *)in_stack_ffffffffffffeb60);
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                  *)in_stack_ffffffffffffeb60);
    }
    not_null<slang::syntax::UdpBodySyntax_*>::operator->
              ((not_null<slang::syntax::UdpBodySyntax_*> *)0x3e4918);
    bVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::empty
                      ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x3e4933);
    src = extraout_RDX;
    if (!bVar7) {
      local_5c4 = 0xa20006;
      not_null<slang::syntax::UdpBodySyntax_*>::operator->
                ((not_null<slang::syntax::UdpBodySyntax_*> *)0x3e4979);
      slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)in_stack_ffffffffffffeb60,
                 (size_t)in_stack_ffffffffffffeb58);
      local_5d8 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffebb0);
      sourceRange.endLoc = in_stack_ffffffffffffeca8;
      sourceRange.startLoc = in_stack_ffffffffffffeca0;
      Scope::addDiag((Scope *)in_stack_ffffffffffffec98,
                     SUB84((ulong)in_stack_ffffffffffffecb0 >> 0x20,0),sourceRange);
      src = extraout_RDX_00;
    }
  }
  else {
    if (local_438->kind != NonAnsiUdpPortList) goto LAB_003e7b49;
    SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
    ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                *)in_stack_ffffffffffffeb70.m_bits);
    pNVar13 = slang::syntax::SyntaxNode::as<slang::syntax::NonAnsiUdpPortListSyntax>(local_438);
    local_680 = &pNVar13->ports;
    local_690 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                          ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0x3e4a69);
    local_6a0 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                          ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)
                           in_stack_ffffffffffffeb60);
    while( true ) {
      bVar7 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
                        ((self_type *)in_stack_ffffffffffffeb60,
                         (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)
                         in_stack_ffffffffffffeb58);
      if (((bVar7 ^ 0xffU) & 1) == 0) break;
      local_6a8 = (SourceLocation)
                  iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                               *)0x3e4b17);
      pTVar1 = (Token *)((long)local_6a8 + 0x18);
      local_6b8.kind = pTVar1->kind;
      local_6b8._2_1_ = pTVar1->field_0x2;
      local_6b8.numFlags.raw = pTVar1->numFlags;
      local_6b8.rawLen = pTVar1->rawLen;
      local_6b8.info = *(Info **)((long)local_6a8 + 0x20);
      sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
      local_6d0 = sVar21;
      local_6d8 = parsing::Token::location(&local_6b8);
      local_6dc = 0;
      local_6c0 = BumpAllocator::
                  emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                            ((BumpAllocator *)
                             CONCAT17(in_stack_ffffffffffffeb97,
                                      CONCAT16(in_stack_ffffffffffffeb96,
                                               CONCAT15(in_stack_ffffffffffffeb95,
                                                        CONCAT14(in_stack_ffffffffffffeb94,
                                                                 in_stack_ffffffffffffeb90)))),
                             in_stack_ffffffffffffeb88,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_ffffffffffffeb80,(SourceLocation *)in_stack_ffffffffffffeb78,
                             (PrimitivePortDirection *)in_stack_ffffffffffffeb70.m_bits);
      SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)
                 in_stack_ffffffffffffeb60,(PrimitivePortSymbol **)in_stack_ffffffffffffeb58);
      Scope::addMember((Scope *)in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
      sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
      local_6f0 = sVar21;
      bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_6f0);
      if (((bVar7 ^ 0xffU) & 1) != 0) {
        sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
        local_3d0 = &local_700;
        local_3d8 = (Symbol *)&local_6c0;
        local_3c8 = local_610;
        local_350 = local_3d8;
        local_348 = local_3d0;
        local_340 = local_610;
        local_700 = sVar21;
        pSVar14 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                  ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                        *)0x3e4d62);
        boost::unordered::detail::foa::
        alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_void>
        ::alloc_cted_or_fwded_key_type(&local_358,pSVar14,local_348);
        local_288 = boost::unordered::detail::foa::
                    alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_void>
                    ::move_or_fwd(&local_358);
        local_280 = &local_359;
        local_290 = local_350;
        local_278 = local_610;
        local_298 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                    ::
                    key_from<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>
                              (local_288,local_350);
        local_2a0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                    ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                *)in_stack_ffffffffffffeb60,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffeb58);
        local_2a8 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                    ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                    *)in_stack_ffffffffffffeb60,(size_t)in_stack_ffffffffffffeb58);
        local_220 = local_298;
        local_230 = local_2a0;
        local_228 = local_2a8;
        local_218 = local_610;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_240,local_2a8);
        do {
          local_248 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_240);
          local_250 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                *)0x3e4ee0);
          local_250 = local_250 + local_248;
          local_254 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::match
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_ffffffffffffeb68,(size_t)in_stack_ffffffffffffeb60);
          if (local_254 != 0) {
            local_260 = boost::unordered::detail::foa::
                        table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                        ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                    *)0x3e4f42);
            local_268 = local_260 + local_248 * 0xf;
            do {
              local_26c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      *)0x3e4f95);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
              ::
              key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
                          *)0x3e4fc9);
              bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_ffffffffffffeb80,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffeb78,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffeb70.m_bits);
              if (bVar7) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                ::table_locator(&local_2c0,local_250,local_26c,local_268 + local_26c);
                goto LAB_003e50e5;
              }
              local_254 = local_254 - 1 & local_254;
            } while (local_254 != 0);
          }
          bVar7 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_ffffffffffffeb60,(size_t)in_stack_ffffffffffffeb58);
          if (bVar7) {
            memset(&local_2c0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
            ::table_locator(&local_2c0);
            goto LAB_003e50e5;
          }
          bVar7 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_240,local_600);
        } while (bVar7);
        memset(&local_2c0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
        ::table_locator(&local_2c0);
LAB_003e50e5:
        bVar7 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_2c0);
        if (bVar7) {
          local_2d0 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      ::make_iterator((locator *)0x3e5107);
          local_2d1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_718,&local_2d0,&local_2d1);
        }
        else if (local_5e0 < local_5e8) {
          in_stack_ffffffffffffeb58 = local_290;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      *)CONCAT17(in_stack_ffffffffffffeb97,
                                 CONCAT16(in_stack_ffffffffffffeb96,
                                          CONCAT15(in_stack_ffffffffffffeb95,
                                                   CONCAT14(in_stack_ffffffffffffeb94,
                                                            in_stack_ffffffffffffeb90)))),
                     (size_t)in_stack_ffffffffffffeb88,(size_t)in_stack_ffffffffffffeb80,
                     (try_emplace_args_t *)in_stack_ffffffffffffeb78,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_ffffffffffffeb70.m_bits,
                     (PrimitivePortSymbol **)
                     CONCAT44(in_stack_ffffffffffffeba4,in_stack_ffffffffffffeba0));
          local_2e8 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      ::make_iterator((locator *)0x3e51a9);
          local_301[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_718,&local_2e8,local_301);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                    (in_stack_ffffffffffffebf0,(size_t)in_stack_ffffffffffffebe8,
                     in_stack_ffffffffffffebe0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                     (PrimitivePortSymbol **)in_stack_ffffffffffffebd0);
          local_318 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      ::make_iterator((locator *)0x3e5224);
          local_331[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_718,&local_318,local_331);
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                  *)in_stack_ffffffffffffeb60);
    }
    local_720 = local_3e8;
    local_728 = (UdpOutputPortDeclSyntax *)0x0;
    pUVar20 = not_null<slang::syntax::UdpBodySyntax_*>::operator->
                        ((not_null<slang::syntax::UdpBodySyntax_*> *)0x3e52ca);
    local_730 = &pUVar20->portDecls;
    local_740 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::begin
                          ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x3e52f5);
    local_750 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::end
                          ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)
                           in_stack_ffffffffffffeb60);
    while( true ) {
      bVar7 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>_>
                        ((self_type *)in_stack_ffffffffffffeb60,
                         (iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)
                         in_stack_ffffffffffffeb58);
      if (((bVar7 ^ 0xffU) & 1) == 0) break;
      local_758 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                               *)0x3e53a3);
      if ((local_758->super_SyntaxNode).kind == UdpOutputPortDecl) {
        local_760 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                              (&local_758->super_SyntaxNode);
        local_778.kind = (local_760->name).kind;
        local_778._2_1_ = (local_760->name).field_0x2;
        local_778.numFlags.raw = (local_760->name).numFlags.raw;
        local_778.rawLen = (local_760->name).rawLen;
        local_778.info = (local_760->name).info;
        sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
        local_380 = &local_798;
        local_378 = local_610;
        local_1f8 = local_380;
        local_1f0 = local_610;
        local_70 = local_380;
        local_68 = local_610;
        local_798 = sVar21;
        local_78 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                               *)in_stack_ffffffffffffeb60,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              in_stack_ffffffffffffeb58);
        psVar6 = local_70;
        local_18 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                   *)in_stack_ffffffffffffeb60,(size_t)in_stack_ffffffffffffeb58);
        local_10 = psVar6;
        local_20 = local_78;
        local_8 = local_610;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_18);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                     ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                               *)0x3e55ac);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_ffffffffffffeb68,(size_t)in_stack_ffffffffffffeb60);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                       ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                   *)0x3e560e);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      *)0x3e5661);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
              ::
              key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
                          *)0x3e5695);
              bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_ffffffffffffeb80,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffeb78,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffeb70.m_bits);
              if (bVar7) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                ::table_locator(&local_210,local_40,local_5c,local_58 + local_5c);
                goto LAB_003e57b1;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          bVar7 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_ffffffffffffeb60,(size_t)in_stack_ffffffffffffeb58);
          if (bVar7) {
            memset(&local_210,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
            ::table_locator(&local_210);
            goto LAB_003e57b1;
          }
          bVar7 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,local_600);
        } while (bVar7);
        memset(&local_210,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
        ::table_locator(&local_210);
LAB_003e57b1:
        local_1e8 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                    ::make_iterator((locator *)0x3e57c0);
        local_370 = local_1e8.pc_;
        local_368 = local_1e8.p_;
        local_788 = local_1e8.pc_;
        local_780 = local_1e8.p_;
        local_7a8 = boost::unordered::
                    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                    ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                           *)0x3e585d);
        bVar7 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_ffffffffffffeb60,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_ffffffffffffeb58);
        if (bVar7) {
          bVar7 = parsing::Token::operator_cast_to_bool((Token *)0x3e58ac);
          if (bVar7) {
            bVar7 = parsing::Token::operator_cast_to_bool((Token *)0x3e58d6);
            if (!bVar7) {
              if (local_728 != (UdpOutputPortDeclSyntax *)0x0) {
                local_7b4 = 0xac0006;
                SVar23 = parsing::Token::range(in_stack_ffffffffffffeb80);
                sourceRange_00.endLoc = in_stack_ffffffffffffeca8;
                sourceRange_00.startLoc = in_stack_ffffffffffffeca0;
                local_7c8 = SVar23;
                in_stack_ffffffffffffef70 =
                     Scope::addDiag((Scope *)in_stack_ffffffffffffec98,
                                    SUB84((ulong)in_stack_ffffffffffffecb0 >> 0x20,0),sourceRange_00
                                   );
                local_7cc = 0xa0001;
                local_7b0 = in_stack_ffffffffffffef70;
                local_7d8 = parsing::Token::location(&local_728->reg);
                Diagnostic::addNote(in_stack_ffffffffffffeb60,
                                    SUB84(in_stack_ffffffffffffeb70.m_bits >> 0x20,0),
                                    in_stack_ffffffffffffeb68);
              }
              local_728 = local_760;
              goto LAB_003e6503;
            }
          }
          ppVar15 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                  *)in_stack_ffffffffffffeb60);
          local_7e0 = ppVar15->second;
          local_7f8.kind = local_778.kind;
          local_7f8._2_1_ = local_778._2_1_;
          local_7f8.numFlags.raw = local_778.numFlags.raw;
          local_7f8.rawLen = local_778.rawLen;
          local_7f8.info = local_778.info;
          nameToken.rawLen = in_stack_ffffffffffffebcc;
          nameToken.kind = (short)in_stack_ffffffffffffebc8;
          nameToken._2_1_ = (char)((uint)in_stack_ffffffffffffebc8 >> 0x10);
          nameToken.numFlags.raw = (char)((uint)in_stack_ffffffffffffebc8 >> 0x18);
          nameToken.info = (Info *)in_stack_ffffffffffffebd0;
          fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
          operator()(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8,nameToken);
          local_7e0->direction = Out;
          in_stack_ffffffffffffef6f = parsing::Token::operator_cast_to_bool((Token *)0x3e5a89);
          if ((bool)in_stack_ffffffffffffef6f) {
            local_7e0->direction = OutReg;
          }
          in_stack_ffffffffffffef60 = parsing::Token::location(&local_778);
          (local_7e0->super_ValueSymbol).super_Symbol.location = in_stack_ffffffffffffef60;
          local_800 = in_stack_ffffffffffffef60;
          Symbol::setSyntax((Symbol *)local_7e0,(SyntaxNode *)local_760);
          in_stack_ffffffffffffef50 = local_7e0;
          in_stack_ffffffffffffef58 = local_3e8;
          std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
          span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                    ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                      *)in_stack_ffffffffffffeb70.m_bits,
                     (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_ffffffffffffeb68
                    );
          syntax_03._M_ptr._4_2_ = in_stack_ffffffffffffeb9c;
          syntax_03._M_ptr._0_4_ = in_stack_ffffffffffffeb98;
          syntax_03._M_ptr._6_1_ = in_stack_ffffffffffffeb9e;
          syntax_03._M_ptr._7_1_ = in_stack_ffffffffffffeb9f;
          syntax_03._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffeba0;
          syntax_03._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffeba4;
          Symbol::setAttributes
                    ((Symbol *)
                     CONCAT17(in_stack_ffffffffffffeb97,
                              CONCAT16(in_stack_ffffffffffffeb96,
                                       CONCAT15(in_stack_ffffffffffffeb95,
                                                CONCAT14(in_stack_ffffffffffffeb94,
                                                         in_stack_ffffffffffffeb90)))),
                     (Scope *)in_stack_ffffffffffffeb88,syntax_03);
        }
        else {
          sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
          local_820[0]._M_str = sVar21._M_str;
          in_stack_ffffffffffffef48 = (PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> *)sVar21._M_len
          ;
          local_820[0]._M_len = (size_t)in_stack_ffffffffffffef48;
          bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_820);
          if (((bVar7 ^ 0xffU) & 1) != 0) {
            local_82c = 0xab0006;
            SVar23 = parsing::Token::range(in_stack_ffffffffffffeb80);
            sourceRange_01.endLoc = in_stack_ffffffffffffeca8;
            sourceRange_01.startLoc = in_stack_ffffffffffffeca0;
            local_840 = SVar23;
            in_stack_ffffffffffffef08 =
                 Scope::addDiag((Scope *)in_stack_ffffffffffffec98,
                                SUB84((ulong)in_stack_ffffffffffffecb0 >> 0x20,0),sourceRange_01);
            local_828 = in_stack_ffffffffffffef08;
            sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
            arg_00._M_len._7_1_ = in_stack_ffffffffffffebaf;
            arg_00._M_len._0_7_ = in_stack_ffffffffffffeba8;
            arg_00._M_str = (char *)in_stack_ffffffffffffebb0;
            local_850 = sVar21;
            Diagnostic::operator<<
                      ((Diagnostic *)CONCAT44(in_stack_ffffffffffffeba4,in_stack_ffffffffffffeba0),
                       arg_00);
          }
        }
      }
      else {
        in_stack_ffffffffffffef00 =
             slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                       (&local_758->super_SyntaxNode);
        local_860 = &in_stack_ffffffffffffef00->names;
        local_858 = in_stack_ffffffffffffef00;
        iVar22 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                           ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0x3e5d16);
        local_868 = iVar22.index;
        in_stack_ffffffffffffeef8 = iVar22.list;
        local_870 = in_stack_ffffffffffffeef8;
        iVar22 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                           ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)
                            in_stack_ffffffffffffeb60);
        local_880 = iVar22;
        while( true ) {
          bVar7 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
                            ((self_type *)in_stack_ffffffffffffeb60,
                             (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)
                             in_stack_ffffffffffffeb58);
          if (((bVar7 ^ 0xffU) & 1) == 0) break;
          local_888 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                      ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                                   *)0x3e5dc4);
          local_898.kind = (local_888->identifier).kind;
          local_898._2_1_ = (local_888->identifier).field_0x2;
          local_898.numFlags.raw = (local_888->identifier).numFlags.raw;
          local_898.rawLen = (local_888->identifier).rawLen;
          local_898.info = (local_888->identifier).info;
          sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
          local_3a0 = &local_8b8;
          local_398 = local_610;
          local_1c0 = local_3a0;
          local_1b8 = local_610;
          local_e8 = local_3a0;
          local_e0 = local_610;
          local_8b8 = sVar21;
          local_f0 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                     ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                               ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                 *)in_stack_ffffffffffffeb60,
                                (basic_string_view<char,_std::char_traits<char>_> *)
                                in_stack_ffffffffffffeb58);
          psVar6 = local_e8;
          local_90 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                     ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                     *)in_stack_ffffffffffffeb60,(size_t)in_stack_ffffffffffffeb58);
          local_88 = psVar6;
          local_98 = local_f0;
          local_80 = local_610;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_a8,local_90);
          do {
            local_b0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_a8);
            local_b8 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                       ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                 *)0x3e5f92);
            local_b8 = local_b8 + local_b0;
            local_bc = boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::match
                                 ((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_ffffffffffffeb68,(size_t)in_stack_ffffffffffffeb60);
            if (local_bc != 0) {
              local_c8 = boost::unordered::detail::foa::
                         table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                         ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                     *)0x3e5ff4);
              local_d0 = local_c8 + local_b0 * 0xf;
              do {
                local_d4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                        *)0x3e6047);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                ::
                key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>>
                          ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
                            *)0x3e607b);
                bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)in_stack_ffffffffffffeb80,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_ffffffffffffeb78,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_ffffffffffffeb70.m_bits);
                if (bVar7) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                  ::table_locator(&local_1d8,local_b8,local_d4,local_d0 + local_d4);
                  goto LAB_003e6197;
                }
                local_bc = local_bc - 1 & local_bc;
              } while (local_bc != 0);
            }
            bVar7 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_ffffffffffffeb60,(size_t)in_stack_ffffffffffffeb58);
            if (bVar7) {
              memset(&local_1d8,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
              ::table_locator(&local_1d8);
              goto LAB_003e6197;
            }
            bVar7 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_a8,local_600);
          } while (bVar7);
          memset(&local_1d8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
          ::table_locator(&local_1d8);
LAB_003e6197:
          local_1b0 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      ::make_iterator((locator *)0x3e61a6);
          local_390 = local_1b0.pc_;
          local_388 = local_1b0.p_;
          local_8a8 = local_1b0.pc_;
          local_8a0 = local_1b0.p_;
          local_8c8 = boost::unordered::
                      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                             *)0x3e6243);
          bVar7 = boost::unordered::detail::foa::operator!=
                            ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              *)in_stack_ffffffffffffeb60,
                             (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              *)in_stack_ffffffffffffeb58);
          if (bVar7) {
            ppVar15 = boost::unordered::detail::foa::
                      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                    *)in_stack_ffffffffffffeb60);
            local_8d0 = ppVar15->second;
            local_8e8.kind = local_898.kind;
            local_8e8._2_1_ = local_898._2_1_;
            local_8e8.numFlags.raw = local_898.numFlags.raw;
            local_8e8.rawLen = local_898.rawLen;
            local_8e8.info = local_898.info;
            nameToken_00.rawLen = in_stack_ffffffffffffebcc;
            nameToken_00.kind = (short)in_stack_ffffffffffffebc8;
            nameToken_00._2_1_ = (char)((uint)in_stack_ffffffffffffebc8 >> 0x10);
            nameToken_00.numFlags.raw = (char)((uint)in_stack_ffffffffffffebc8 >> 0x18);
            nameToken_00.info = (Info *)in_stack_ffffffffffffebd0;
            fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
            operator()(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8,nameToken_00);
            local_8f0 = parsing::Token::location(&local_898);
            (local_8d0->super_ValueSymbol).super_Symbol.location = local_8f0;
            Symbol::setSyntax((Symbol *)local_8d0,(SyntaxNode *)local_888);
            std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                      ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                        *)in_stack_ffffffffffffeb70.m_bits,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       in_stack_ffffffffffffeb68);
            syntax_04._M_ptr._4_2_ = in_stack_ffffffffffffeb9c;
            syntax_04._M_ptr._0_4_ = in_stack_ffffffffffffeb98;
            syntax_04._M_ptr._6_1_ = in_stack_ffffffffffffeb9e;
            syntax_04._M_ptr._7_1_ = in_stack_ffffffffffffeb9f;
            syntax_04._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffeba0;
            syntax_04._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffeba4;
            Symbol::setAttributes
                      ((Symbol *)
                       CONCAT17(in_stack_ffffffffffffeb97,
                                CONCAT16(in_stack_ffffffffffffeb96,
                                         CONCAT15(in_stack_ffffffffffffeb95,
                                                  CONCAT14(in_stack_ffffffffffffeb94,
                                                           in_stack_ffffffffffffeb90)))),
                       (Scope *)in_stack_ffffffffffffeb88,syntax_04);
          }
          else {
            sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
            local_910[0] = sVar21;
            bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_910);
            if (((bVar7 ^ 0xffU) & 1) != 0) {
              local_91c = 0xab0006;
              SVar23 = parsing::Token::range(in_stack_ffffffffffffeb80);
              sourceRange_02.endLoc = in_stack_ffffffffffffeca8;
              sourceRange_02.startLoc = in_stack_ffffffffffffeca0;
              local_930 = SVar23;
              local_918 = Scope::addDiag((Scope *)in_stack_ffffffffffffec98,
                                         SUB84((ulong)in_stack_ffffffffffffecb0 >> 0x20,0),
                                         sourceRange_02);
              sVar21 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
              arg_01._M_len._7_1_ = in_stack_ffffffffffffebaf;
              arg_01._M_len._0_7_ = in_stack_ffffffffffffeba8;
              arg_01._M_str = (char *)in_stack_ffffffffffffebb0;
              local_940 = sVar21;
              Diagnostic::operator<<
                        ((Diagnostic *)CONCAT44(in_stack_ffffffffffffeba4,in_stack_ffffffffffffeba0)
                         ,arg_01);
            }
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                      *)in_stack_ffffffffffffeb60);
        }
      }
LAB_003e6503:
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                  *)in_stack_ffffffffffffeb60);
    }
    if (local_728 != (UdpOutputPortDeclSyntax *)0x0) {
      local_958 = *(Symbol **)&local_728->name;
      pIStack_950 = (local_728->name).info;
      local_978 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
      local_3c0 = (Scope *)&local_978;
      local_3b8 = local_610;
      local_188 = local_3c0;
      local_180 = local_610;
      local_160 = local_3c0;
      local_158 = local_610;
      local_168 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                  ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                              *)in_stack_ffffffffffffeb60,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_ffffffffffffeb58);
      pSVar5 = local_160;
      local_108 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                  *)in_stack_ffffffffffffeb60,(size_t)in_stack_ffffffffffffeb58);
      local_100 = pSVar5;
      local_110 = local_168;
      local_f8 = local_610;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_120,local_108);
      do {
        local_128 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_120);
        local_130 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                    ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                              *)0x3e66da);
        local_130 = local_130 + local_128;
        local_134 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_ffffffffffffeb68,(size_t)in_stack_ffffffffffffeb60);
        if (local_134 != 0) {
          local_140 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                      ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                                  *)0x3e673c);
          local_148 = local_140 + local_128 * 0xf;
          do {
            local_14c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_ffffffffffffed80 =
                 (BitTrie *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                         *)0x3e678f);
            in_stack_ffffffffffffed88 = local_100;
            in_stack_ffffffffffffed90 =
                 (PrimitiveSymbol *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                 ::
                 key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>>
                           ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
                             *)0x3e67c3);
            bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               in_stack_ffffffffffffeb80,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffeb78,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffeb70.m_bits);
            if (bVar7) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
              ::table_locator(&local_1a0,local_130,local_14c,local_148 + local_14c);
              goto LAB_003e68df;
            }
            local_134 = local_134 - 1 & local_134;
          } while (local_134 != 0);
        }
        bVar7 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_ffffffffffffeb60,(size_t)in_stack_ffffffffffffeb58);
        if (bVar7) {
          memset(&local_1a0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
          ::table_locator(&local_1a0);
          goto LAB_003e68df;
        }
        bVar7 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_120,local_600);
      } while (bVar7);
      memset(&local_1a0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
      ::table_locator(&local_1a0);
LAB_003e68df:
      local_178 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                  ::make_iterator((locator *)0x3e68ee);
      local_3b0 = (SymbolMap *)local_178.pc_;
      local_3a8 = (Symbol *)local_178.p_;
      local_968 = (SymbolMap *)local_178.pc_;
      local_960 = (Symbol *)local_178.p_;
      ppVar15 = boost::unordered::detail::foa::
                table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              *)in_stack_ffffffffffffeb60);
      local_980 = ppVar15->second;
      pSVar16 = Symbol::getSyntax((Symbol *)local_980);
      if (pSVar16 != (SyntaxNode *)0x0) {
        if (local_980->direction == OutReg) {
          local_998 = local_958;
          pIStack_990 = pIStack_950;
          nameToken_01.rawLen = in_stack_ffffffffffffebcc;
          nameToken_01.kind = (short)in_stack_ffffffffffffebc8;
          nameToken_01._2_1_ = (char)((uint)in_stack_ffffffffffffebc8 >> 0x10);
          nameToken_01.numFlags.raw = (char)((uint)in_stack_ffffffffffffebc8 >> 0x18);
          nameToken_01.info = (Info *)in_stack_ffffffffffffebd0;
          fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
          operator()(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8,nameToken_01);
        }
        else if (local_980->direction == In) {
          local_9a4 = 0xad0006;
          local_9b8 = parsing::Token::range(in_stack_ffffffffffffeb80);
          sourceRange_03.endLoc = in_stack_ffffffffffffeca8;
          sourceRange_03.startLoc = in_stack_ffffffffffffeca0;
          local_9a0 = Scope::addDiag((Scope *)in_stack_ffffffffffffec98,
                                     SUB84((ulong)in_stack_ffffffffffffecb0 >> 0x20,0),
                                     sourceRange_03);
          local_9c8 = (local_980->super_ValueSymbol).super_Symbol.name._M_len;
          pcStack_9c0 = (local_980->super_ValueSymbol).super_Symbol.name._M_str;
          arg_02._M_len._7_1_ = in_stack_ffffffffffffebaf;
          arg_02._M_len._0_7_ = in_stack_ffffffffffffeba8;
          arg_02._M_str = (char *)in_stack_ffffffffffffebb0;
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT44(in_stack_ffffffffffffeba4,in_stack_ffffffffffffeba0),
                     arg_02);
        }
        else {
          local_980->direction = OutReg;
        }
      }
    }
    local_9d0 = local_4b8;
    local_9d8 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::begin(local_9d0);
    local_9e0 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::end(local_9d0);
    for (; local_9d8 != local_9e0; local_9d8 = local_9d8 + 1) {
      local_9e8 = *local_9d8;
      pSVar16 = Symbol::getSyntax((Symbol *)local_9e8);
      if (pSVar16 == (SyntaxNode *)0x0) {
        bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          (&(local_9e8->super_ValueSymbol).super_Symbol.name);
        if (!bVar7) {
          local_9f4 = 0xaa0006;
          local_a00 = (local_9e8->super_ValueSymbol).super_Symbol.location;
          local_9f0 = Scope::addDiag(in_stack_ffffffffffffec00,
                                     SUB84((ulong)in_stack_ffffffffffffec10 >> 0x20,0),
                                     in_stack_ffffffffffffec08);
          local_a18 = (local_9e8->super_ValueSymbol).super_Symbol.name._M_len;
          pcStack_a10 = (local_9e8->super_ValueSymbol).super_Symbol.name._M_str;
          arg_03._M_len._7_1_ = in_stack_ffffffffffffebaf;
          arg_03._M_len._0_7_ = in_stack_ffffffffffffeba8;
          arg_03._M_str = (char *)in_stack_ffffffffffffebb0;
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT44(in_stack_ffffffffffffeba4,in_stack_ffffffffffffeba0),
                     arg_03);
        }
      }
    }
    SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
    ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
                 *)0x3e6c62);
    src = extraout_RDX_01;
  }
  iVar10 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                     (local_4b8,(EVP_PKEY_CTX *)local_3f8,src);
  local_a40 = CONCAT44(extraout_var,iVar10);
  std::span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::PrimitivePortSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffeb70.m_bits,
             (span<const_slang::ast::PrimitivePortSymbol_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffeb68);
  (local_410->ports)._M_ptr = local_a30;
  (local_410->ports)._M_extent._M_extent_value = local_a28;
  sVar17 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::size(local_4b8);
  if (sVar17 < 2) {
    local_a44 = 0xae0006;
    local_a50 = (local_410->super_Symbol).location;
    Scope::addDiag(in_stack_ffffffffffffec00,SUB84((ulong)in_stack_ffffffffffffec10 >> 0x20,0),
                   in_stack_ffffffffffffec08);
    TVar3.info = local_af0.info;
    TVar3.kind = local_af0.kind;
    TVar3._2_1_ = local_af0._2_1_;
    TVar3.numFlags.raw = local_af0.numFlags.raw;
    TVar3.rawLen = local_af0.rawLen;
    goto LAB_003e7b49;
  }
  ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[](local_4b8,0);
  DVar26 = SUB84((ulong)in_stack_ffffffffffffec10 >> 0x20,0);
  if ((*ppPVar18)->direction == In) {
    local_a54 = 0xa70006;
    ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[](local_4b8,0);
    local_a60 = ((*ppPVar18)->super_ValueSymbol).super_Symbol.location;
    Scope::addDiag(in_stack_ffffffffffffec00,DVar26,in_stack_ffffffffffffec08);
    TVar3.info = local_af0.info;
    TVar3.kind = local_af0.kind;
    TVar3._2_1_ = local_af0._2_1_;
    TVar3.numFlags.raw = local_af0.numFlags.raw;
    TVar3.rawLen = local_af0.rawLen;
    goto LAB_003e7b49;
  }
  local_a68 = (ExpressionSyntax *)0x0;
  ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[](local_4b8,0);
  if ((*ppPVar18)->direction == OutReg) {
    local_410->isSequential = true;
    ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[](local_4b8,0);
    local_a70 = Symbol::getSyntax((Symbol *)*ppPVar18);
    if ((local_a70 != (SyntaxNode *)0x0) && (local_a70->kind == UdpOutputPortDecl)) {
      local_a78 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>(local_a70);
      if (local_a78->initializer != (EqualsValueClauseSyntax *)0x0) {
        local_a68 = not_null::operator_cast_to_ExpressionSyntax_
                              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x3e6ef8);
      }
    }
  }
  local_a80 = 1;
  while( true ) {
    uVar4 = local_a80;
    sVar17 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::size(local_4b8);
    DVar26 = SUB84((ulong)in_stack_ffffffffffffecb0 >> 0x20,0);
    extraFlags.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffef08 >> 0x38);
    if (sVar17 <= uVar4) break;
    ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                         (local_4b8,local_a80);
    extraFlags.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffef08 >> 0x38);
    code = SUB84((ulong)in_stack_ffffffffffffec10 >> 0x20,0);
    if ((*ppPVar18)->direction != In) {
      local_a84 = 0xa40006;
      DVar26 = local_3e8._4_4_;
      ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                           (local_4b8,local_a80);
      local_a90 = ((*ppPVar18)->super_ValueSymbol).super_Symbol.location;
      Scope::addDiag(in_stack_ffffffffffffec00,code,in_stack_ffffffffffffec08);
      break;
    }
    local_a80 = local_a80 + 1;
  }
  SVar19 = (SourceLocation)
           not_null<slang::syntax::UdpBodySyntax_*>::operator->
                     ((not_null<slang::syntax::UdpBodySyntax_*> *)0x3e7023);
  TVar2.info = local_af0.info;
  TVar2.kind = local_af0.kind;
  TVar2._2_1_ = local_af0._2_1_;
  TVar2.numFlags.raw = local_af0.numFlags.raw;
  TVar2.rawLen = local_af0.rawLen;
  SVar24.endLoc = in_stack_ffffffffffffec98;
  SVar24.startLoc = in_stack_ffffffffffffeca0;
  local_a98 = *(long *)((long)SVar19 + 0x50);
  if (local_a98 != 0) {
    if ((local_410->isSequential & 1U) == 0) {
      local_a9c = 0xa60006;
      SVar24 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffebb0);
      sourceRange_04.endLoc = SVar19;
      sourceRange_04.startLoc = SVar24.startLoc;
      local_ab0 = SVar24;
      Scope::addDiag((Scope *)SVar24.endLoc,DVar26,sourceRange_04);
      TVar2.info = local_af0.info;
      TVar2.kind = local_af0.kind;
      TVar2._2_1_ = local_af0._2_1_;
      TVar2.numFlags.raw = local_af0.numFlags.raw;
      TVar2.rawLen = local_af0.rawLen;
    }
    else {
      if (local_a68 == (ExpressionSyntax *)0x0) {
        local_a68 = not_null::operator_cast_to_ExpressionSyntax_
                              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x3e7246);
        local_b00 = parsing::Token::valueText((Token *)in_stack_ffffffffffffeb70.m_bits);
        bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_b00);
        if (!bVar7) {
          ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                               (local_4b8,0);
          bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            (&((*ppPVar18)->super_ValueSymbol).super_Symbol.name);
          if (!bVar7) {
            local_b18 = local_b00;
            ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                                 (local_4b8,0);
            local_b28 = ((*ppPVar18)->super_ValueSymbol).super_Symbol.name._M_len;
            local_b20 = ((*ppPVar18)->super_ValueSymbol).super_Symbol.name._M_str;
            __x._M_str._0_4_ = in_stack_ffffffffffffeb90;
            __x._M_len = (size_t)in_stack_ffffffffffffeb88;
            __x._M_str._4_1_ = in_stack_ffffffffffffeb94;
            __x._M_str._5_1_ = in_stack_ffffffffffffeb95;
            __x._M_str._6_1_ = in_stack_ffffffffffffeb96;
            __x._M_str._7_1_ = in_stack_ffffffffffffeb97;
            __y._M_str = (char *)in_stack_ffffffffffffeb80;
            __y._M_len = (size_t)in_stack_ffffffffffffeb78;
            bVar7 = std::operator==(__x,__y);
            if (((bVar7 ^ 0xffU) & 1) != 0) {
              local_b34 = 0xaf0006;
              local_b48 = parsing::Token::range(in_stack_ffffffffffffeb80);
              sourceRange_06.endLoc = SVar19;
              sourceRange_06.startLoc = in_stack_ffffffffffffeca0;
              local_b30 = Scope::addDiag((Scope *)in_stack_ffffffffffffec98,DVar26,sourceRange_06);
              arg_04._M_len._7_1_ = in_stack_ffffffffffffebaf;
              arg_04._M_len._0_7_ = in_stack_ffffffffffffeba8;
              arg_04._M_str = (char *)in_stack_ffffffffffffebb0;
              local_b58 = local_b00;
              Diagnostic::operator<<
                        ((Diagnostic *)CONCAT44(in_stack_ffffffffffffeba4,in_stack_ffffffffffffeba0)
                         ,arg_04);
              local_b5c = 0x50001;
              ppPVar18 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                                   (local_4b8,0);
              local_b68 = ((*ppPVar18)->super_ValueSymbol).super_Symbol.location;
              Diagnostic::addNote(in_stack_ffffffffffffeb60,
                                  SUB84(in_stack_ffffffffffffeb70.m_bits >> 0x20,0),
                                  in_stack_ffffffffffffeb68);
            }
          }
        }
      }
      else {
        local_abc = 0xa30006;
        local_ad0 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffebb0);
        sourceRange_05.endLoc = SVar19;
        sourceRange_05.startLoc = in_stack_ffffffffffffeca0;
        local_ab8 = Scope::addDiag((Scope *)in_stack_ffffffffffffec98,DVar26,sourceRange_05);
        local_ad4 = 0xa0001;
        local_af0 = slang::syntax::SyntaxNode::getFirstToken
                              ((SyntaxNode *)
                               CONCAT17(in_stack_ffffffffffffeb97,
                                        CONCAT16(in_stack_ffffffffffffeb96,
                                                 CONCAT15(in_stack_ffffffffffffeb95,
                                                          CONCAT14(in_stack_ffffffffffffeb94,
                                                                   in_stack_ffffffffffffeb90)))));
        local_ae0 = parsing::Token::location(&local_af0);
        Diagnostic::addNote(in_stack_ffffffffffffeb60,
                            SUB84(in_stack_ffffffffffffeb70.m_bits >> 0x20,0),
                            in_stack_ffffffffffffeb68);
      }
      SVar24.endLoc = in_stack_ffffffffffffec98;
      SVar24.startLoc = in_stack_ffffffffffffeca0;
      TVar2 = local_af0;
    }
  }
  local_af0 = TVar2;
  if (local_a68 != (ExpressionSyntax *)0x0) {
    local_bb8 = LookupLocation::max;
    uStack_bb0 = DAT_00de66d0;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_bc0,None);
    lookupLocation._8_8_ = in_stack_ffffffffffffeb80;
    lookupLocation.scope = in_stack_ffffffffffffeb78;
    ASTContext::ASTContext
              ((ASTContext *)in_stack_ffffffffffffeb68,(Scope *)in_stack_ffffffffffffeb60,
               lookupLocation,in_stack_ffffffffffffeb70);
    pEVar25 = local_a68;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_bd0,None);
    iVar10 = Expression::bind((int)pEVar25,local_ba0,(socklen_t)local_bd0.m_bits);
    local_bc8 = (int *)CONCAT44(extraout_var_00,iVar10);
    bVar7 = Expression::bad((Expression *)in_stack_ffffffffffffeb60);
    if (!bVar7) {
      if (*local_bc8 == 1) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x3e75bc);
        bVar11 = Type::getBitWidth((Type *)in_stack_ffffffffffffeb68);
        if (bVar11 != 1) {
          bVar7 = Expression::isUnsizedInteger((Expression *)in_stack_ffffffffffffeb68);
          if (!bVar7) goto LAB_003e7854;
        }
        local_bf9[0].m_bits = '\0';
        bitmask<slang::ast::EvalFlags>::bitmask(local_bf9);
        ASTContext::eval((ASTContext *)in_stack_ffffffffffffef00,
                         (Expression *)in_stack_ffffffffffffeef8,extraFlags);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x3e764f);
        if (*(long *)(local_bc8 + 4) != 0) {
          local_c08 = slang::ConstantValue::integer((ConstantValue *)0x3e7673);
          SVInt::SVInt<int>((SVInt *)in_stack_ffffffffffffeb60,
                            (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20));
          lVar8 = SVInt::operator==((SVInt *)in_stack_ffffffffffffeb88,
                                    (SVInt *)in_stack_ffffffffffffeb80);
          index = (int32_t)((ulong)local_c08 >> 0x20);
          local_c0a = lVar8.value;
          SVInt::SVInt<int>((SVInt *)in_stack_ffffffffffffeb60,
                            (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20));
          local_c21 = (uint8_t)SVInt::operator==((SVInt *)in_stack_ffffffffffffeb88,
                                                 (SVInt *)in_stack_ffffffffffffeb80);
          local_c09 = (uint8_t)logic_t::operator||((logic_t *)in_stack_ffffffffffffeb58,
                                                   (logic_t *)0x3e7721);
          bVar11 = SVInt::getBitWidth(local_c08);
          if (bVar11 == 1) {
            local_c39 = (uint8_t)SVInt::operator[]((SVInt *)CONCAT17(lVar8.value,
                                                                     in_stack_ffffffffffffeba8),
                                                   index);
            local_c3a = 0x80;
            exactlyEqual((logic_t)local_c39,(logic_t)0x80);
          }
          bVar9 = operator||((logic_t)0x0,false);
          SVInt::~SVInt((SVInt *)in_stack_ffffffffffffeb70.m_bits);
          SVInt::~SVInt((SVInt *)in_stack_ffffffffffffeb70.m_bits);
          if ((bVar9 & 1) != 0) {
            local_410->initVal = *(ConstantValue **)(local_bc8 + 4);
          }
        }
      }
LAB_003e7854:
      if (local_410->initVal == (ConstantValue *)0x0) {
        local_c40 = 0xa50006;
        local_c58 = *(undefined8 *)(local_bc8 + 8);
        uStack_c50 = *(undefined8 *)(local_bc8 + 10);
        sourceRange_07.endLoc = SVar19;
        sourceRange_07.startLoc = SVar24.startLoc;
        Scope::addDiag((Scope *)SVar24.endLoc,DVar26,sourceRange_07);
      }
    }
  }
  BitTrie::BitTrie(&local_ca0);
  BumpAllocator::BumpAllocator((BumpAllocator *)in_stack_ffffffffffffeb60);
  PoolAllocator<slang::ast::BitTrie,_72UL,_8UL>::PoolAllocator(&local_cc0,&local_cb0);
  SmallVector<slang::ast::PrimitiveSymbol::TableEntry,_2UL>::SmallVector
            ((SmallVector<slang::ast::PrimitiveSymbol::TableEntry,_2UL> *)0x3e78f1);
  pUVar20 = not_null<slang::syntax::UdpBodySyntax_*>::operator->
                      ((not_null<slang::syntax::UdpBodySyntax_*> *)0x3e7902);
  local_d10 = &pUVar20->entries;
  local_d18._M_current =
       (UdpEntrySyntax **)
       std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL> *)
                  in_stack_ffffffffffffeb58);
  std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffeb68);
  while( true ) {
    bVar7 = __gnu_cxx::
            operator==<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffeb60,
                       (__normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffeb58);
    if (((bVar7 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
    ::operator*(&local_d18);
    SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::size(local_4b8);
    createTableRow((Scope *)in_stack_ffffffffffffef70,
                   (UdpEntrySyntax *)CONCAT17(in_stack_ffffffffffffef6f,in_stack_ffffffffffffef68),
                   (SmallVector<slang::ast::PrimitiveSymbol::TableEntry,_2UL> *)
                   in_stack_ffffffffffffef60,(size_t)in_stack_ffffffffffffef58,
                   (BitTrie *)in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    bVar7 = SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::empty(&local_d08);
    if ((!bVar7) && ((local_410->isEdgeSensitive & 1U) == 0)) {
      in_stack_ffffffffffffeb70.m_bits =
           (underlying_type)
           SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::back(&local_d08);
      local_410->isEdgeSensitive =
           (bool)(((reference)in_stack_ffffffffffffeb70.m_bits)->isEdgeSensitive & 1);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_d18);
  }
  iVar10 = SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::copy
                     (&local_d08,(EVP_PKEY_CTX *)local_3f8,src_00);
  this = extraout_RDX_02;
  std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>::
  span<slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>
            ((span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL> *)
             in_stack_ffffffffffffeb70.m_bits,
             (span<slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL> *)
             CONCAT44(extraout_var_01,iVar10));
  (local_410->table)._M_ptr = local_d38;
  (local_410->table)._M_extent._M_extent_value = sStack_d30;
  checkPrimitiveEdgeCombinations
            (in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,in_stack_ffffffffffffed80);
  SmallVector<slang::ast::PrimitiveSymbol::TableEntry,_2UL>::~SmallVector
            ((SmallVector<slang::ast::PrimitiveSymbol::TableEntry,_2UL> *)0x3e7b0e);
  BumpAllocator::~BumpAllocator(this);
  TVar3 = local_af0;
LAB_003e7b49:
  local_a1c = 1;
  local_3e0 = local_410;
  local_af0 = TVar3;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *)0x3e7b56);
  return local_3e0;
}

Assistant:

PrimitiveSymbol& PrimitiveSymbol::fromSyntax(const Scope& scope,
                                             const UdpDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto primName = syntax.name.valueText();
    auto prim = comp.emplace<PrimitiveSymbol>(comp, primName, syntax.name.location(),
                                              PrimitiveSymbol::UserDefined);
    prim->setAttributes(scope, syntax.attributes);
    prim->setSyntax(syntax);

    auto portList = syntax.portList.get();
    if (portList->kind == SyntaxKind::WildcardUdpPortList) {
        auto externPrim = comp.getExternDefinition(primName, scope);
        if (!externPrim || externPrim->kind != SyntaxKind::ExternUdpDecl)
            scope.addDiag(diag::MissingExternWildcardPorts, portList->sourceRange()) << primName;
        else
            portList = externPrim->as<ExternUdpDeclSyntax>().portList;
    }

    SmallVector<const PrimitivePortSymbol*> ports;
    if (portList->kind == SyntaxKind::AnsiUdpPortList) {
        for (auto decl : portList->as<AnsiUdpPortListSyntax>().ports) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                PrimitivePortDirection dir = PrimitivePortDirection::Out;
                if (outputDecl.reg)
                    dir = PrimitivePortDirection::OutReg;

                auto port = comp.emplace<PrimitivePortSymbol>(comp, outputDecl.name.valueText(),
                                                              outputDecl.name.location(), dir);
                port->setSyntax(*decl);
                port->setAttributes(scope, decl->attributes);
                ports.push_back(port);
                prim->addMember(*port);
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(),
                                                                  name.location(),
                                                                  PrimitivePortDirection::In);

                    port->setSyntax(*nameSyntax);
                    port->setAttributes(scope, decl->attributes);
                    ports.push_back(port);
                    prim->addMember(*port);
                }
            }
        }

        if (!syntax.body->portDecls.empty())
            scope.addDiag(diag::PrimitiveAnsiMix, syntax.body->portDecls[0]->sourceRange());
    }
    else if (portList->kind == SyntaxKind::NonAnsiUdpPortList) {
        // In the non-ansi case the port list only gives the ordering, we need to
        // look through the body decls to get the rest of the port info.
        SmallMap<std::string_view, PrimitivePortSymbol*, 4> portMap;
        for (auto nameSyntax : portList->as<NonAnsiUdpPortListSyntax>().ports) {
            auto name = nameSyntax->identifier;
            auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(), name.location(),
                                                          PrimitivePortDirection::In);
            ports.push_back(port);
            prim->addMember(*port);
            if (!name.valueText().empty())
                portMap.emplace(name.valueText(), port);
        }

        auto checkDup = [&](auto port, auto nameToken) {
            // If this port already has a syntax node set it's a duplicate declaration.
            if (auto prevSyntax = port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortDup, nameToken.range());
                diag << nameToken.valueText();
                diag.addNote(diag::NotePreviousDefinition, port->location);
            }
        };

        const UdpOutputPortDeclSyntax* regSpecifier = nullptr;
        for (auto decl : syntax.body->portDecls) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                auto name = outputDecl.name;
                if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                    // Standalone "reg" specifiers should be saved and processed at the
                    // end once we've handled all of the regular declarations.
                    if (outputDecl.reg && !outputDecl.keyword) {
                        if (regSpecifier) {
                            auto& diag = scope.addDiag(diag::PrimitiveRegDup,
                                                       outputDecl.reg.range());
                            diag.addNote(diag::NotePreviousDefinition,
                                         regSpecifier->reg.location());
                        }
                        regSpecifier = &outputDecl;
                        continue;
                    }

                    auto port = it->second;
                    checkDup(port, name);

                    port->direction = PrimitivePortDirection::Out;
                    if (outputDecl.reg)
                        port->direction = PrimitivePortDirection::OutReg;

                    port->location = name.location();
                    port->setSyntax(outputDecl);
                    port->setAttributes(scope, decl->attributes);
                }
                else if (!name.valueText().empty()) {
                    auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                    diag << name.valueText();
                }
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                        auto port = it->second;
                        checkDup(port, name);

                        // Direction is already set to In here, so just update
                        // our syntax, location, etc.
                        port->location = name.location();
                        port->setSyntax(*nameSyntax);
                        port->setAttributes(scope, decl->attributes);
                    }
                    else if (!name.valueText().empty()) {
                        auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                        diag << name.valueText();
                    }
                }
            }
        }

        if (regSpecifier) {
            auto name = regSpecifier->name;
            auto it = portMap.find(name.valueText());
            SLANG_ASSERT(it != portMap.end());

            auto port = it->second;
            if (port->getSyntax()) {
                if (port->direction == PrimitivePortDirection::OutReg) {
                    checkDup(port, name);
                }
                else if (port->direction == PrimitivePortDirection::In) {
                    auto& diag = scope.addDiag(diag::PrimitiveRegInput, name.range());
                    diag << port->name;
                }
                else {
                    port->direction = PrimitivePortDirection::OutReg;
                }
            }
        }

        for (auto port : ports) {
            if (!port->getSyntax() && !port->name.empty()) {
                auto& diag = scope.addDiag(diag::PrimitivePortMissing, port->location);
                diag << port->name;
            }
        }
    }
    else {
        // This is an error condition (wildcard port list without a
        // corresponding extern decl). The error has already been
        // issued so just get out of here.
        return *prim;
    }

    prim->ports = ports.copy(comp);
    if (ports.size() < 2)
        scope.addDiag(diag::PrimitiveTwoPorts, prim->location);
    else if (ports[0]->direction == PrimitivePortDirection::In)
        scope.addDiag(diag::PrimitiveOutputFirst, ports[0]->location);
    else {
        const ExpressionSyntax* initExpr = nullptr;
        if (ports[0]->direction == PrimitivePortDirection::OutReg) {
            prim->isSequential = true;

            // If the first port is an 'output reg' check if it specifies
            // the initial value inline.
            auto portSyntax = ports[0]->getSyntax();
            if (portSyntax && portSyntax->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outSyntax = portSyntax->as<UdpOutputPortDeclSyntax>();
                if (outSyntax.initializer)
                    initExpr = outSyntax.initializer->expr;
            }
        }

        // Make sure we have only one output port.
        for (size_t i = 1; i < ports.size(); i++) {
            if (ports[i]->direction != PrimitivePortDirection::In) {
                scope.addDiag(diag::PrimitiveDupOutput, ports[i]->location);
                break;
            }
        }

        // If we have an initial statement check it for correctness.
        if (auto initial = syntax.body->initialStmt) {
            if (!prim->isSequential)
                scope.addDiag(diag::PrimitiveInitialInComb, initial->sourceRange());
            else if (initExpr) {
                auto& diag = scope.addDiag(diag::PrimitiveDupInitial, initial->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, initExpr->getFirstToken().location());
            }
            else {
                initExpr = initial->value;

                auto initialName = initial->name.valueText();
                if (!initialName.empty() && !ports[0]->name.empty() &&
                    initialName != ports[0]->name) {
                    auto& diag = scope.addDiag(diag::PrimitiveWrongInitial, initial->name.range());
                    diag << initialName;
                    diag.addNote(diag::NoteDeclarationHere, ports[0]->location);
                }
            }
        }

        if (initExpr) {
            ASTContext context(scope, LookupLocation::max);
            auto& expr = Expression::bind(*initExpr, context);
            if (!expr.bad()) {
                if (expr.kind == ExpressionKind::IntegerLiteral &&
                    (expr.type->getBitWidth() == 1 || expr.isUnsizedInteger())) {
                    context.eval(expr);
                    if (expr.constant) {
                        auto& val = expr.constant->integer();
                        if (val == 0 || val == 1 ||
                            (val.getBitWidth() == 1 && exactlyEqual(val[0], logic_t::x))) {
                            prim->initVal = expr.constant;
                        }
                    }
                }

                if (!prim->initVal)
                    scope.addDiag(diag::PrimitiveInitVal, expr.sourceRange);
            }
        }

        BitTrie trie;
        BumpAllocator alloc;
        PoolAllocator<BitTrie> trieAlloc(alloc);
        SmallVector<TableEntry> table;
        for (auto entry : syntax.body->entries) {
            createTableRow(scope, *entry, table, ports.size(), trie, trieAlloc);
            if (!table.empty() && !prim->isEdgeSensitive)
                prim->isEdgeSensitive = table.back().isEdgeSensitive;
        }

        prim->table = table.copy(comp);
        checkPrimitiveEdgeCombinations(*prim, scope, trie);
    }

    return *prim;
}